

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_dart.cpp
# Opt level: O3

string * __thiscall
flatbuffers::dart::DartGenerator::NamespaceAliasFromUnionType_abi_cxx11_
          (string *__return_storage_ptr__,DartGenerator *this,Namespace *root_namespace,Type *type)

{
  size_type *psVar1;
  byte bVar2;
  undefined8 uVar3;
  Type *pTVar4;
  bool bVar5;
  int iVar6;
  byte *pbVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  undefined8 *puVar9;
  pointer pbVar10;
  uint uVar11;
  ulong uVar12;
  string ns;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  qualified_name_parts;
  ulong *local_c0;
  long local_b8;
  ulong local_b0 [2];
  ulong *local_a0;
  long local_98;
  ulong local_90 [2];
  undefined1 *local_80;
  long local_78;
  undefined1 local_70;
  undefined7 uStack_6f;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  DartGenerator *local_48;
  Type *local_40;
  string *local_38;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_60,&((type->struct_def->super_Definition).defined_namespace)->components);
  bVar5 = std::__equal<false>::equal<std::__cxx11::string*,std::__cxx11::string_const*>
                    ((root_namespace->components).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (root_namespace->components).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,
                     local_60.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start);
  if (bVar5) {
    (*(this->namer_).super_Namer._vptr_Namer[0xf])
              (__return_storage_ptr__,&this->namer_,type->struct_def);
    goto LAB_001d109e;
  }
  local_80 = &local_70;
  local_78 = 0;
  local_70 = 0;
  local_48 = this;
  local_40 = type;
  local_38 = __return_storage_ptr__;
  if (local_60.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_60.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar8 = local_60.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pbVar10 = local_60.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      if (pbVar10->_M_string_length != 0) {
        uVar12 = 0;
        do {
          pbVar7 = (byte *)(pbVar10->_M_dataplus)._M_p;
          if (uVar12 == 0) {
LAB_001d0efd:
            uVar11 = (uint)*pbVar7;
          }
          else {
            bVar2 = pbVar7[uVar12];
            uVar11 = (uint)(char)bVar2;
            if ((9 < uVar11 - 0x30) && (iVar6 = toupper((uint)bVar2), bVar2 == (byte)iVar6)) {
              std::__cxx11::string::append((char *)&local_80);
              pbVar7 = (byte *)((pbVar10->_M_dataplus)._M_p + uVar12);
              goto LAB_001d0efd;
            }
          }
          tolower(uVar11 & 0xff);
          std::__cxx11::string::push_back((char)&local_80);
          uVar12 = uVar12 + 1;
          pbVar8 = local_60.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        } while (uVar12 < pbVar10->_M_string_length);
      }
      if (pbVar10 != pbVar8 + -1) {
        std::__cxx11::string::append((char *)&local_80);
        pbVar8 = local_60.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
      pbVar10 = pbVar10 + 1;
    } while (pbVar10 != pbVar8);
  }
  local_c0 = local_b0;
  std::__cxx11::string::_M_construct<char*>((string *)&local_c0,local_80,local_80 + local_78);
  __return_storage_ptr__ = local_38;
  pTVar4 = local_40;
  std::__cxx11::string::append((char *)&local_c0);
  (*(local_48->namer_).super_Namer._vptr_Namer[0xf])(&local_a0,&local_48->namer_,pTVar4->struct_def)
  ;
  uVar12 = 0xf;
  if (local_c0 != local_b0) {
    uVar12 = local_b0[0];
  }
  if (uVar12 < (ulong)(local_98 + local_b8)) {
    uVar12 = 0xf;
    if (local_a0 != local_90) {
      uVar12 = local_90[0];
    }
    if (uVar12 < (ulong)(local_98 + local_b8)) goto LAB_001d0ffa;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_a0,0,(char *)0x0,(ulong)local_c0);
  }
  else {
LAB_001d0ffa:
    puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_c0,(ulong)local_a0);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar1 = puVar9 + 2;
  if ((size_type *)*puVar9 == psVar1) {
    uVar3 = puVar9[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar3;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar9;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
  }
  __return_storage_ptr__->_M_string_length = puVar9[1];
  *puVar9 = psVar1;
  puVar9[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if (local_a0 != local_90) {
    operator_delete(local_a0,local_90[0] + 1);
  }
  if (local_c0 != local_b0) {
    operator_delete(local_c0,local_b0[0] + 1);
  }
  if (local_80 != &local_70) {
    operator_delete(local_80,CONCAT71(uStack_6f,local_70) + 1);
  }
LAB_001d109e:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_60);
  return __return_storage_ptr__;
}

Assistant:

std::string NamespaceAliasFromUnionType(Namespace *root_namespace,
                                          const Type &type) {
    const std::vector<std::string> qualified_name_parts =
        type.struct_def->defined_namespace->components;
    if (std::equal(root_namespace->components.begin(),
                   root_namespace->components.end(),
                   qualified_name_parts.begin())) {
      return namer_.Type(*type.struct_def);
    }

    std::string ns;

    for (auto it = qualified_name_parts.begin();
         it != qualified_name_parts.end(); ++it) {
      auto &part = *it;

      for (size_t i = 0; i < part.length(); i++) {
        if (i && !isdigit(part[i]) && part[i] == CharToUpper(part[i])) {
          ns += "_";
          ns += CharToLower(part[i]);
        } else {
          ns += CharToLower(part[i]);
        }
      }
      if (it != qualified_name_parts.end() - 1) { ns += "_"; }
    }

    return ns + "." + namer_.Type(*type.struct_def);
  }